

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_log_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_2b::BuildLogTestMultiTargetEdge::Run(BuildLogTestMultiTargetEdge *this)

{
  Test *pTVar1;
  bool bVar2;
  reference ppEVar3;
  Entries *this_00;
  size_type sVar4;
  LogEntry *pLVar5;
  allocator<char> local_e9;
  string local_e8;
  LogEntry *local_c8;
  LogEntry *e2;
  string local_b8;
  LogEntry *local_98;
  LogEntry *e1;
  undefined1 local_80 [8];
  BuildLog log;
  BuildLogTestMultiTargetEdge *this_local;
  
  ManifestParserOptions::ManifestParserOptions((ManifestParserOptions *)&log.needs_recompaction_);
  AssertParse(&(this->super_BuildLogTest).super_StateTestWithBuiltinRules.state_,
              "build out out.d: cat\n",(ManifestParserOptions)log._96_8_);
  BuildLog::BuildLog((BuildLog *)local_80);
  ppEVar3 = std::vector<Edge_*,_std::allocator<Edge_*>_>::operator[]
                      (&(this->super_BuildLogTest).super_StateTestWithBuiltinRules.state_.edges_,0);
  BuildLog::RecordCommand((BuildLog *)local_80,*ppEVar3,0x15,0x16,0);
  pTVar1 = g_current_test;
  this_00 = BuildLog::entries((BuildLog *)local_80);
  sVar4 = std::
          unordered_map<StringPiece,_BuildLog::LogEntry_*,_std::hash<StringPiece>,_std::equal_to<StringPiece>,_std::allocator<std::pair<const_StringPiece,_BuildLog::LogEntry_*>_>_>
          ::size(this_00);
  bVar2 = testing::Test::Check
                    (pTVar1,sVar4 == 2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_log_test.cc"
                     ,0x131,"2u == log.entries().size()");
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"out",(allocator<char> *)((long)&e2 + 7));
    pLVar5 = BuildLog::LookupByOutput((BuildLog *)local_80,&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&e2 + 7));
    local_98 = pLVar5;
    bVar2 = testing::Test::Check
                      (g_current_test,pLVar5 != (LogEntry *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_log_test.cc"
                       ,0x133,"e1");
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"out.d",&local_e9);
      pLVar5 = BuildLog::LookupByOutput((BuildLog *)local_80,&local_e8);
      std::__cxx11::string::~string((string *)&local_e8);
      std::allocator<char>::~allocator(&local_e9);
      local_c8 = pLVar5;
      bVar2 = testing::Test::Check
                        (g_current_test,pLVar5 != (LogEntry *)0x0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_log_test.cc"
                         ,0x135,"e2");
      pTVar1 = g_current_test;
      if (bVar2) {
        bVar2 = std::operator==("out",&local_98->output);
        bVar2 = testing::Test::Check
                          (pTVar1,bVar2,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_log_test.cc"
                           ,0x136,"\"out\" == e1->output");
        pTVar1 = g_current_test;
        if (bVar2) {
          bVar2 = std::operator==("out.d",&local_c8->output);
          bVar2 = testing::Test::Check
                            (pTVar1,bVar2,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_log_test.cc"
                             ,0x137,"\"out.d\" == e2->output");
          if (bVar2) {
            bVar2 = testing::Test::Check
                              (g_current_test,local_98->start_time == 0x15,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_log_test.cc"
                               ,0x138,"21 == e1->start_time");
            if (bVar2) {
              bVar2 = testing::Test::Check
                                (g_current_test,local_c8->start_time == 0x15,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_log_test.cc"
                                 ,0x139,"21 == e2->start_time");
              if (bVar2) {
                bVar2 = testing::Test::Check
                                  (g_current_test,local_c8->end_time == 0x16,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_log_test.cc"
                                   ,0x13a,"22 == e2->end_time");
                if (bVar2) {
                  bVar2 = testing::Test::Check
                                    (g_current_test,local_c8->end_time == 0x16,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_log_test.cc"
                                     ,0x13b,"22 == e2->end_time");
                  if (bVar2) {
                    e1._0_4_ = 0;
                  }
                  else {
                    testing::Test::AddAssertionFailure(g_current_test);
                    e1._0_4_ = 1;
                  }
                }
                else {
                  testing::Test::AddAssertionFailure(g_current_test);
                  e1._0_4_ = 1;
                }
              }
              else {
                testing::Test::AddAssertionFailure(g_current_test);
                e1._0_4_ = 1;
              }
            }
            else {
              testing::Test::AddAssertionFailure(g_current_test);
              e1._0_4_ = 1;
            }
          }
          else {
            testing::Test::AddAssertionFailure(g_current_test);
            e1._0_4_ = 1;
          }
        }
        else {
          testing::Test::AddAssertionFailure(g_current_test);
          e1._0_4_ = 1;
        }
      }
      else {
        testing::Test::AddAssertionFailure(g_current_test);
        e1._0_4_ = 1;
      }
    }
    else {
      testing::Test::AddAssertionFailure(g_current_test);
      e1._0_4_ = 1;
    }
  }
  else {
    testing::Test::AddAssertionFailure(g_current_test);
    e1._0_4_ = 1;
  }
  BuildLog::~BuildLog((BuildLog *)local_80);
  return;
}

Assistant:

TEST_F(BuildLogTest, MultiTargetEdge) {
  AssertParse(&state_,
"build out out.d: cat\n");

  BuildLog log;
  log.RecordCommand(state_.edges_[0], 21, 22);

  ASSERT_EQ(2u, log.entries().size());
  BuildLog::LogEntry* e1 = log.LookupByOutput("out");
  ASSERT_TRUE(e1);
  BuildLog::LogEntry* e2 = log.LookupByOutput("out.d");
  ASSERT_TRUE(e2);
  ASSERT_EQ("out", e1->output);
  ASSERT_EQ("out.d", e2->output);
  ASSERT_EQ(21, e1->start_time);
  ASSERT_EQ(21, e2->start_time);
  ASSERT_EQ(22, e2->end_time);
  ASSERT_EQ(22, e2->end_time);
}